

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast.h
# Opt level: O0

void __thiscall
ikfast::IkSolution<double>::GetSolution
          (IkSolution<double> *this,vector<double,_std::allocator<double>_> *solution,
          vector<double,_std::allocator<double>_> *freevalues)

{
  int iVar1;
  reference pvVar2;
  size_type sVar3;
  const_reference local_40;
  vector<double,_std::allocator<double>_> *freevalues_local;
  vector<double,_std::allocator<double>_> *solution_local;
  IkSolution<double> *this_local;
  
  iVar1 = (*(this->super_IkSolutionBase<double>)._vptr_IkSolutionBase[5])();
  std::vector<double,_std::allocator<double>_>::resize(solution,(long)iVar1);
  pvVar2 = std::vector<double,_std::allocator<double>_>::at(solution,0);
  sVar3 = std::vector<double,_std::allocator<double>_>::size(freevalues);
  if (sVar3 == 0) {
    local_40 = (const_reference)0x0;
  }
  else {
    local_40 = std::vector<double,_std::allocator<double>_>::at(freevalues,0);
  }
  (*(this->super_IkSolutionBase<double>)._vptr_IkSolutionBase[2])(this,pvVar2,local_40);
  return;
}

Assistant:

virtual void GetSolution(std::vector<T>& solution, const std::vector<T>& freevalues) const {
        solution.resize(GetDOF());
        GetSolution(&solution.at(0), freevalues.size() > 0 ? &freevalues.at(0) : NULL);
    }